

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_TEXBEM(Context *ctx)

{
  size_t in_RCX;
  size_t in_RDX;
  size_t in_R8;
  char sampler [64];
  char src [64];
  char dst [64];
  char code [512];
  
  get_GLSL_destarg_varname(ctx,dst,in_RDX);
  get_GLSL_srcarg_varname(ctx,0,src,in_RCX);
  get_GLSL_varname_in_buf(ctx,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum,sampler,in_R8);
  make_GLSL_destarg_assign
            (ctx,code,0x200,
             "texture2D(%s, vec2(%s.x + (%s_texbem.x * %s.x) + (%s_texbem.z * %s.y), %s.y + (%s_texbem.y * %s.x) + (%s_texbem.w * %s.y)))"
             ,sampler,dst,sampler,src,sampler,src,dst,sampler,src,sampler,src);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_GLSL_TEXBEM(Context *ctx)
{
    DestArgInfo *info = &ctx->dest_arg;
    char dst[64]; get_GLSL_destarg_varname(ctx, dst, sizeof (dst));
    char src[64]; get_GLSL_srcarg_varname(ctx, 0, src, sizeof (src));
    char sampler[64];
    char code[512];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    get_GLSL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                            sampler, sizeof (sampler));

    make_GLSL_destarg_assign(ctx, code, sizeof (code),
        "texture2D(%s, vec2(%s.x + (%s_texbem.x * %s.x) + (%s_texbem.z * %s.y),"
        " %s.y + (%s_texbem.y * %s.x) + (%s_texbem.w * %s.y)))",
        sampler,
        dst, sampler, src, sampler, src,
        dst, sampler, src, sampler, src);

    output_line(ctx, "%s", code);
}